

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O0

U32 __thiscall
LASquadtree::intersect_circle(LASquadtree *this,F64 center_x,F64 center_y,F64 radius,U32 level)

{
  vector<int,_std::allocator<int>_> *this_00;
  size_type sVar1;
  double r_min_x_00;
  double r_min_y_00;
  double r_max_x_00;
  double r_max_y_00;
  F64 r_max_y;
  F64 r_max_x;
  F64 r_min_y;
  F64 r_min_x;
  U32 level_local;
  F64 radius_local;
  F64 center_y_local;
  F64 center_x_local;
  LASquadtree *this_local;
  
  if (this->current_cells == (void *)0x0) {
    this_00 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
    std::vector<int,_std::allocator<int>_>::vector(this_00);
    this->current_cells = this_00;
  }
  else {
    std::vector<int,_std::allocator<int>_>::clear
              ((vector<int,_std::allocator<int>_> *)this->current_cells);
  }
  r_min_x_00 = (double)center_x - (double)radius;
  r_min_y_00 = (double)center_y - (double)radius;
  r_max_x_00 = (double)center_x + (double)radius;
  r_max_y_00 = (double)center_y + (double)radius;
  if ((((r_max_x_00 <= (double)(float)this->min_x) || ((double)(float)this->max_x < r_min_x_00)) ||
      (r_max_y_00 <= (double)(float)this->min_y)) || ((double)(float)this->max_y < r_min_y_00)) {
    this_local._4_4_ = 0;
  }
  else {
    if (this->adaptive == (U32 *)0x0) {
      intersect_circle_with_cells
                (this,center_x,center_y,radius,(F64)r_min_x_00,(F64)r_min_y_00,(F64)r_max_x_00,
                 (F64)r_max_y_00,this->min_x,this->max_x,this->min_y,this->max_y,level,0);
    }
    else {
      intersect_circle_with_cells_adaptive
                (this,center_x,center_y,radius,(F64)r_min_x_00,(F64)r_min_y_00,(F64)r_max_x_00,
                 (F64)r_max_y_00,this->min_x,this->max_x,this->min_y,this->max_y,0,0);
    }
    sVar1 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)this->current_cells);
    this_local._4_4_ = (U32)sVar1;
  }
  return this_local._4_4_;
}

Assistant:

U32 LASquadtree::intersect_circle(const F64 center_x, const F64 center_y, const F64 radius, U32 level)
{
  if (current_cells == 0)
  {
    current_cells = (void*) new my_cell_vector;
  }
  else
  {
    ((my_cell_vector*)current_cells)->clear();
  }

  F64 r_min_x = center_x - radius; 
  F64 r_min_y = center_y - radius; 
  F64 r_max_x = center_x + radius;
  F64 r_max_y = center_y + radius;

  if (r_max_x <= min_x || !(r_min_x <= max_x) || r_max_y <= min_y || !(r_min_y <= max_y))
  {
    return 0;
  }

  if (adaptive)
  {
    intersect_circle_with_cells_adaptive(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, min_x, max_x, min_y, max_y, 0, 0);
  }
  else
  {
    intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, min_x, max_x, min_y, max_y, level, 0);
  }

  return (U32)(((my_cell_vector*)current_cells)->size());
}